

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh.cc
# Opt level: O2

VarnodeData * __thiscall PcodeCacher::expandPool(PcodeCacher *this,uint4 size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  VarnodeData *pVVar3;
  pointer pPVar4;
  pointer pPVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  VarnodeData *pVVar9;
  uint uVar10;
  long lVar11;
  _List_node_base *p_Var12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  
  pVVar3 = this->poolstart;
  pVVar9 = this->curpool;
  uVar8 = ((long)pVVar9 - (long)pVVar3) / 0x18;
  uVar14 = size + (int)uVar8;
  uVar15 = (uint)(((long)this->endpool - (long)pVVar3) / 0x18);
  uVar7 = uVar14 - uVar15;
  if (uVar15 <= uVar14 && uVar7 != 0) {
    uVar10 = 100;
    if (100 < uVar7) {
      uVar10 = uVar7;
    }
    pVVar9 = (VarnodeData *)operator_new__((ulong)(uVar10 + uVar15) * 0x18);
    for (lVar11 = 0; (uVar8 & 0xffffffff) * 0x18 - lVar11 != 0; lVar11 = lVar11 + 0x18) {
      *(undefined8 *)((long)&pVVar9->size + lVar11) = *(undefined8 *)((long)&pVVar3->size + lVar11);
      puVar1 = (undefined8 *)((long)&pVVar3->space + lVar11);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pVVar9->space + lVar11);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
    }
    pPVar4 = (this->issued).super__Vector_base<PcodeData,_std::allocator<PcodeData>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar5 = (this->issued).super__Vector_base<PcodeData,_std::allocator<PcodeData>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (uVar7 = 0; uVar13 = (ulong)uVar7, uVar13 < (ulong)((long)pPVar5 - (long)pPVar4 >> 5);
        uVar7 = uVar7 + 1) {
      if (pPVar4[uVar13].outvar != (VarnodeData *)0x0) {
        pPVar4[uVar13].outvar =
             (VarnodeData *)(((long)pPVar4[uVar13].outvar - (long)pVVar3) + (long)pVVar9);
      }
      if (pPVar4[uVar13].invar != (VarnodeData *)0x0) {
        pPVar4[uVar13].invar =
             (VarnodeData *)(((long)pPVar4[uVar13].invar - (long)pVVar3) + (long)pVVar9);
      }
    }
    p_Var12 = (_List_node_base *)&this->label_refs;
    while (p_Var12 = (((_List_base<RelativeRecord,_std::allocator<RelativeRecord>_> *)
                      &p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var12 != (_List_node_base *)&this->label_refs) {
      p_Var12[1]._M_next =
           (_List_node_base *)(((long)p_Var12[1]._M_next - (long)pVVar3) + (long)pVVar9);
    }
    if (pVVar3 != (VarnodeData *)0x0) {
      operator_delete__(pVVar3);
    }
    this->poolstart = pVVar9;
    this->curpool = pVVar9 + uVar14;
    this->endpool = pVVar9 + (uVar10 + uVar15);
    pVVar9 = pVVar9 + (uVar8 & 0xffffffff);
  }
  return pVVar9;
}

Assistant:

VarnodeData *PcodeCacher::expandPool(uint4 size)

{ // Expand the pool so that -size- more elements fit
  // Return pointer to first available element
  uint4 curmax = endpool - poolstart;
  uint4 cursize = curpool - poolstart;
  if (cursize + size <= curmax)
    return curpool;		// No expansion necessary
  uint4 increase = (cursize + size) - curmax;
  if (increase < 100)		// Increase by at least 100
    increase = 100;

  uint4 newsize = curmax + increase;

  VarnodeData *newpool = new VarnodeData[newsize];
  for(uint4 i=0;i<cursize;++i)
    newpool[i] = poolstart[i];	// Copy old data
  // Update references to the old pool
  for(uint4 i=0;i<issued.size();++i) {
    VarnodeData *outvar = issued[i].outvar;
    if (outvar != (VarnodeData *)0) {
      outvar = newpool + (outvar - poolstart);
      issued[i].outvar = outvar;
    }
    VarnodeData *invar = issued[i].invar;
    if (invar != (VarnodeData *)0) {
      invar = newpool + (invar - poolstart);
      issued[i].invar = invar;
    }
  }
  list<RelativeRecord>::iterator iter;
  for(iter=label_refs.begin();iter!=label_refs.end();++iter) {
    VarnodeData *ref = (*iter).dataptr;
    (*iter).dataptr = newpool + (ref - poolstart);
  }
  
  delete [] poolstart;		// Free up old pool
  poolstart = newpool;
  curpool = newpool + (cursize + size);
  endpool = newpool + newsize;
  return newpool + cursize;
}